

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.h
# Opt level: O1

int __thiscall
CCharmapToUniUcs2Big::mapchar(CCharmapToUniUcs2Big *this,wchar_t *ch,char **p,size_t *len)

{
  ulong uVar1;
  byte *pbVar2;
  
  uVar1 = *len;
  if (1 < uVar1) {
    pbVar2 = (byte *)*p;
    *p = (char *)(pbVar2 + 1);
    *ch = (uint)*pbVar2 << 8;
    pbVar2 = (byte *)*p;
    *p = (char *)(pbVar2 + 1);
    *ch = *ch | (uint)*pbVar2;
    *len = *len - 2;
  }
  return (uint)(1 < uVar1);
}

Assistant:

virtual int mapchar(wchar_t &ch, const char *&p, size_t &len)
    {
        if (len >= 2)
        {
            /* map the character */
            ch = ((unsigned char)*p++) << 8;
            ch |= (unsigned char)*p++;

            /* deduct it from the length */
            len -= 2;

            /* success */
            return TRUE;
        }
        else
            return FALSE;
    }